

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

unsigned_short readushort(FILE *f,int bigendian)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uchar c2;
  uchar c1;
  undefined2 local_12;
  
  local_12 = (undefined2)((ulong)in_RAX >> 0x30);
  sVar2 = fread((void *)((long)&local_12 + 1),1,1,(FILE *)f);
  if (sVar2 == 0) {
    readushort_cold_2();
  }
  else {
    sVar2 = fread(&local_12,1,1,(FILE *)f);
    if (sVar2 != 0) {
      uVar1 = local_12._1_1_;
      if (bigendian != 0) {
        uVar1 = (undefined1)local_12;
        local_12._0_1_ = local_12._1_1_;
      }
      return CONCAT11((undefined1)local_12,uVar1);
    }
    readushort_cold_1();
  }
  return 0;
}

Assistant:

static unsigned short readushort(FILE * f, int bigendian)
{
    unsigned char c1, c2;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (!fread(&c2, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (bigendian) {
        return (unsigned short)((c1 << 8) + c2);
    } else {
        return (unsigned short)((c2 << 8) + c1);
    }
}